

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
::walkModule(Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
             *this,Module *module)

{
  Unsubtyping *this_00;
  pointer puVar1;
  long *plVar2;
  Function *pFVar3;
  pointer puVar4;
  Global *pGVar5;
  Expression *pEVar6;
  ElementSegment *pEVar7;
  pointer ppEVar8;
  pointer puVar9;
  undefined8 *puVar10;
  pointer puVar11;
  _Any_data *module_00;
  Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  *pWVar12;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  Table *pTVar15;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  undefined8 *puVar19;
  Type sub;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar20;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar21;
  pointer puVar22;
  long *plVar23;
  pointer ppEVar24;
  PassRunner local_330;
  Pass local_240 [3];
  void *local_138;
  long local_128;
  _Any_data local_100;
  code *local_f0;
  _Any_data local_e0;
  code *local_d0;
  _Any_data *local_c0;
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  _List_node_base *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Module *local_48;
  Module *local_40;
  Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  *local_38;
  
  this->currModule = module;
  local_68._M_unused._M_object = &local_48;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp:349:14)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp:349:14)>
             ::_M_manager;
  analysis._24_8_ = &analysis.field_0x8;
  analysis._8_4_ = 0;
  analysis._16_8_ = 0;
  analysis._40_8_ = 0;
  puVar16 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = (_Any_data *)module;
  analysis._32_8_ = analysis._24_8_;
  local_48 = module;
  local_38 = this;
  if (puVar16 != puVar1) {
    do {
      local_240[0]._vptr_Pass =
           (_func_int **)
           (puVar16->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                    *)&analysis,(key_type *)local_240);
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar1);
  }
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             &analysis.field_0x30,
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             &local_68);
  plVar23 = *(long **)(local_c0->_M_pod_data + 0x18);
  plVar2 = *(long **)(local_c0->_M_pod_data + 0x20);
  if (plVar23 != plVar2) {
    do {
      pFVar3 = (Function *)*plVar23;
      if (*(char **)((long)&(pFVar3->super_Importable).module.super_IString.str + 8) != (char *)0x0)
      {
        local_330._vptr_PassRunner = (_func_int **)pFVar3;
        pmVar13 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                  ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                                *)&analysis,(key_type *)&local_330);
        local_240[0]._vptr_Pass = (_func_int **)pFVar3;
        if (local_78 == (_List_node_base *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_70)(&analysis.field_0x30,local_240,pmVar13);
      }
      plVar23 = plVar23 + 1;
    } while (plVar23 != plVar2);
  }
  module_00 = local_c0;
  local_330.options.arguments._M_h._M_buckets = &local_330.options.arguments._M_h._M_single_bucket;
  local_330._vptr_PassRunner = (_func_int **)&PTR__PassRunner_010714e0;
  local_330.wasm = (Module *)local_c0;
  local_330.allocator = (MixedArena *)(local_c0->_M_pod_data + 0x200);
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_330._41_8_ = 0;
  local_330.options.validate = true;
  local_330.options.validateGlobally = true;
  local_330.options.optimizeLevel = 0;
  local_330.options.shrinkLevel = 0;
  local_330.options.inlining.alwaysInlineMaxSize = 2;
  local_330.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_330.options.inlining.flexibleInlineMaxSize = 0x14;
  local_330.options.inlining.allowFunctionsWithLoops = false;
  local_330.options.printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  local_330.options.targetJS = false;
  local_330.options.inlining.partialInliningIfs = 0;
  local_330.options.ignoreImplicitTraps = false;
  local_330.options.trapsNeverHappen = false;
  local_330.options.lowMemoryUnused = false;
  local_330.options.fastMath = false;
  local_330.options.zeroFilledMemory = false;
  local_330.options.closedWorld = false;
  local_330.options.debugInfo = false;
  local_330.options.generateStackIR = false;
  local_330.options.optimizeStackIR = false;
  local_330.options.arguments._M_h._M_bucket_count = 1;
  local_330.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_330.options.arguments._M_h._M_element_count = 0;
  local_330.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_330.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_330.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_330.options.passesToSkip._M_h._M_buckets =
       &local_330.options.passesToSkip._M_h._M_single_bucket;
  local_330.options.passesToSkip._M_h._M_bucket_count = 1;
  local_330.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_330.options.passesToSkip._M_h._M_element_count = 0;
  local_330.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_330.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_330.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_330.isNested = false;
  local_330.addedPassesRemovedDWARF = false;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             &local_e0,
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             &analysis.field_0x30);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::Unsubtyping&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm
  ::(anonymous_namespace)::Unsubtyping,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,wasm::(anonymous_namespace)::Unsubtyping>>>&,std::function<void(wasm::
  Function*,wasm::(anonymous)::Unsubtyping__>_
            (local_240,(Module *)module_00,(Map *)&analysis,(Func *)&local_e0);
  if (local_240[0].runner == &local_330 || local_240[0].runner == (PassRunner *)0x0) {
    sub.id = (uintptr_t)local_c0;
    local_240[0].runner = &local_330;
    (**(code **)((long)local_240[0]._vptr_Pass + 0x10))();
    local_240[0]._vptr_Pass = (_func_int **)&PTR__Mapper_010767f8;
    if (local_f0 != (code *)0x0) {
      sub.id = (uintptr_t)&local_100;
      (*local_f0)(sub.id,sub.id,3);
    }
    if (local_138 != (void *)0x0) {
      sub.id = local_128 - (long)local_138;
      operator_delete(local_138,sub.id);
    }
    Pass::~Pass(local_240);
    if (local_d0 != (code *)0x0) {
      sub.id = (uintptr_t)&local_e0;
      (*local_d0)((_Any_data *)sub.id,(_Any_data *)sub.id,__destroy_functor);
    }
    PassRunner::~PassRunner(&local_330);
    if (local_78 != (_List_node_base *)0x0) {
      sub.id = (uintptr_t)&analysis.field_0x30;
      (*(code *)local_78)(sub.id,sub.id,3);
    }
    if (local_58 != (code *)0x0) {
      sub.id = (uintptr_t)&local_68;
      (*local_58)(sub.id,sub.id,3);
    }
    this_00 = (Unsubtyping *)(local_38[-1].stack.fixed._M_elems + 7);
    for (p_Var14 = (_Rb_tree_node_base *)analysis._24_8_;
        p_Var14 != (_Rb_tree_node_base *)&analysis.field_0x8;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      p_Var17 = (_Base_ptr)&p_Var14[0xe]._M_right;
      while (p_Var17 = *(_Base_ptr *)p_Var17, p_Var17 != (_Base_ptr)0x0) {
        sub.id = (uintptr_t)p_Var17->_M_parent;
        anon_unknown_22::Unsubtyping::noteSubtype
                  (this_00,(HeapType)sub.id,(HeapType)p_Var17->_M_left);
      }
      for (p_Var17 = p_Var14[0x10]._M_left; p_Var17 != (_Base_ptr)0x0;
          p_Var17 = *(_Base_ptr *)p_Var17) {
        p_Var18 = p_Var17 + 1;
        while (p_Var18 = *(_Base_ptr *)p_Var18, p_Var18 != (_Base_ptr)0x0) {
          sub.id = (uintptr_t)p_Var17->_M_parent;
          anon_unknown_22::Unsubtyping::noteCast
                    (this_00,(HeapType)sub.id,(HeapType)p_Var18->_M_parent);
        }
      }
    }
    puVar4 = (local_48->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar21 = (local_48->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4;
        puVar21 = puVar21 + 1) {
      pGVar5 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      pEVar6 = pGVar5->init;
      if (pEVar6 != (Expression *)0x0) {
        sub.id = (pEVar6->type).id;
        anon_unknown_22::Unsubtyping::noteSubtype(this_00,sub,(Type)(pGVar5->type).id);
      }
    }
    puVar20 = (local_48->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (Module *)
               (local_48->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((Module *)puVar20 != local_40) {
      do {
        pEVar7 = (puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar7->offset != (Expression *)0x0) {
          sub.id = (pEVar7->type).id;
          pTVar15 = Module::getTable(local_38->currModule,(Name)(pEVar7->table).super_IString.str);
          anon_unknown_22::Unsubtyping::noteSubtype(this_00,sub,(Type)(pTVar15->type).id);
        }
        ppEVar8 = *(pointer *)
                   ((long)&(pEVar7->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   + 8);
        for (ppEVar24 = *(pointer *)
                         &(pEVar7->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar24 != ppEVar8; ppEVar24 = ppEVar24 + 1) {
          sub.id = ((*ppEVar24)->type).id;
          anon_unknown_22::Unsubtyping::noteSubtype(this_00,sub,(Type)(pEVar7->type).id);
        }
        puVar20 = puVar20 + 1;
      } while ((Module *)puVar20 != local_40);
    }
    local_38->currModule = local_48;
    puVar4 = (local_48->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = local_48;
    for (puVar21 = (local_48->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4;
        puVar21 = puVar21 + 1) {
      sub.id = (uintptr_t)
               (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(long *)(sub.id + 0x20) == 0) {
        sub.id = sub.id + 0x40;
        walk(local_38,(Expression **)sub.id);
      }
    }
    puVar20 = (local_40->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (local_40->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != puVar9) {
      do {
        sub.id = (uintptr_t)
                 (puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (*(long *)(sub.id + 0x28) != 0) {
          walk(local_38,(Expression **)(sub.id + 0x28));
          sub.id = (uintptr_t)
                   (puVar20->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        puVar10 = *(undefined8 **)(sub.id + 0x40);
        for (puVar19 = *(undefined8 **)(sub.id + 0x38); puVar19 != puVar10; puVar19 = puVar19 + 1) {
          local_240[0]._vptr_Pass = (_func_int **)*puVar19;
          sub.id = (uintptr_t)local_240;
          walk(local_38,(Expression **)local_240);
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar9);
    }
    puVar11 = (local_40->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar22 = (local_40->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pWVar12 = local_38, puVar22 != puVar11
        ; puVar22 = puVar22 + 1) {
      sub.id = (uintptr_t)
               (puVar22->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (*(long *)(sub.id + 0x30) != 0) {
        sub.id = sub.id + 0x30;
        walk(local_38,(Expression **)sub.id);
      }
    }
    local_38->currModule = (Module *)0x0;
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
    ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                *)analysis._16_8_,(_Link_type)sub.id);
    pWVar12->currModule = (Module *)0x0;
    return;
  }
  __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
}

Assistant:

void walkModule(Module* module) {
    setModule(module);
    static_cast<SubType*>(this)->doWalkModule(module);
    static_cast<SubType*>(this)->visitModule(module);
    setModule(nullptr);
  }